

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_check.c
# Opt level: O0

int check_logical_error_lx(mod2sparse *l,char *orig_error,char *decoding)

{
  int len;
  int iVar1;
  char *out_vec;
  char *v;
  char *in_RDX;
  char *in_RSI;
  mod2sparse *in_RDI;
  int logical_error;
  char *log_check;
  char *residual;
  int k;
  int n;
  uint local_34;
  undefined8 in_stack_ffffffffffffffd0;
  
  iVar1 = in_RDI->n_cols;
  len = in_RDI->n_rows;
  out_vec = (char *)chk_alloc((uint)((ulong)in_stack_ffffffffffffffd0 >> 0x20),
                              (uint)in_stack_ffffffffffffffd0);
  v = (char *)chk_alloc((uint)((ulong)in_stack_ffffffffffffffd0 >> 0x20),
                        (uint)in_stack_ffffffffffffffd0);
  bin_char_add(in_RSI,in_RDX,out_vec,iVar1);
  mod2sparse_mulvec(in_RDI,out_vec,v);
  iVar1 = bin_char_is_zero(v,len);
  local_34 = (uint)(iVar1 == 0);
  free(v);
  free(out_vec);
  return local_34;
}

Assistant:

int check_logical_error_lx(mod2sparse* l,char *orig_error,char *decoding){

    int n = mod2sparse_cols(l);
    int k = mod2sparse_rows(l);
    char *residual=chk_alloc(n,sizeof(*residual));
    char *log_check=chk_alloc(n,sizeof(*log_check));

    int logical_error=0;
    bin_char_add(orig_error,decoding,residual,n);
    mod2sparse_mulvec(l,residual,log_check);
    if(!bin_char_is_zero(log_check,k)) logical_error=1;

    free(log_check);
    free(residual);

    return logical_error;

}